

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O3

void __thiscall
wasm::DAE::removeReturnValue(wasm::Function*,std::vector<wasm::Call*,std::allocator<wasm::
Call*>>&,wasm::Module*)::ReturnUpdater::visitReturn(wasm::Return__(void *this,Return *curr)

{
  Expression *pEVar1;
  Drop *this_00;
  Block *this_01;
  Builder local_38;
  Builder builder;
  
  pEVar1 = curr->value;
  if (pEVar1 != (Expression *)0x0) {
    curr->value = (Expression *)0x0;
    local_38.wasm = *(Module **)((long)this + 0xd8);
    this_00 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    this_00->value = pEVar1;
    Drop::finalize(this_00);
    this_01 = Builder::makeBlock(&local_38,(Expression *)this_00);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)curr);
    Block::finalize(this_01);
    Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_>::replaceCurrent
              ((Walker<ReturnUpdater,_wasm::Visitor<ReturnUpdater,_void>_> *)this,
               (Expression *)this_01);
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                ,0x149,
                "void wasm::DAE::removeReturnValue(Function *, std::vector<Call *> &, Module *)::ReturnUpdater::visitReturn(Return *)"
               );
}

Assistant:

void visitReturn(Return* curr) {
        auto* value = curr->value;
        assert(value);
        curr->value = nullptr;
        Builder builder(*module);
        replaceCurrent(builder.makeSequence(builder.makeDrop(value), curr));
      }